

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedMessageFieldGenerator::
InternalGenerateTypeDependentAccessorDeclarations
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  RepeatedMessageFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "$deprecated_attr$$type$* mutable_$name$(int index);\n$deprecated_attr$$type$* add_$name$();\n"
                    );
  if ((this->dependent_getter_ & 1U) != 0) {
    io::Printer::Print(printer,&this->variables_,
                       "$deprecated_attr$const ::google::protobuf::RepeatedPtrField< $type$ >&\n    $name$() const;\n"
                      );
  }
  io::Printer::Print(printer,&this->variables_,
                     "$deprecated_attr$::google::protobuf::RepeatedPtrField< $type$ >*\n    mutable_$name$();\n"
                    );
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
InternalGenerateTypeDependentAccessorDeclarations(io::Printer* printer) const {
  printer->Print(variables_,
    "$deprecated_attr$$type$* mutable_$name$(int index);\n"
    "$deprecated_attr$$type$* add_$name$();\n");
  if (dependent_getter_) {
    printer->Print(variables_,
      "$deprecated_attr$const ::google::protobuf::RepeatedPtrField< $type$ >&\n"
      "    $name$() const;\n");
  }
  printer->Print(variables_,
    "$deprecated_attr$::google::protobuf::RepeatedPtrField< $type$ >*\n"
    "    mutable_$name$();\n");
}